

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LessEvaluationTest.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  byte bVar1;
  double dVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  Variable y;
  Variable x;
  undefined7 in_stack_fffffffffffffb98;
  undefined1 in_stack_fffffffffffffb9f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba8;
  undefined7 in_stack_fffffffffffffbd0;
  undefined1 in_stack_fffffffffffffbd7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd8;
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [36];
  undefined4 local_374;
  Variable *in_stack_fffffffffffffca0;
  Variable *in_stack_fffffffffffffca8;
  string local_338 [32];
  string local_318 [36];
  undefined4 local_2f4;
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [56];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [56];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [132];
  int local_4;
  
  local_4 = 0;
  Kandinsky::Variable::Variable((Variable *)0x1124ae);
  Kandinsky::Variable::Variable((Variable *)0x1124bb);
  Kandinsky::Variable::setValue
            ((Variable *)in_stack_fffffffffffffba0,
             (double)CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
  Kandinsky::Variable::setValue
            ((Variable *)in_stack_fffffffffffffba0,
             (double)CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
  Kandinsky::operator<<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  Kandinsky::Expression::evaluate((Expression *)0x112517);
  Kandinsky::Variable::evaluate((Variable *)0x11254c);
  std::__cxx11::to_string((double)in_stack_fffffffffffffba8);
  std::operator+((char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
  std::operator+(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
  Kandinsky::Variable::evaluate((Variable *)0x1125b8);
  std::__cxx11::to_string((double)in_stack_fffffffffffffba8);
  std::operator+(in_stack_fffffffffffffbd8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
  std::operator+(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
  Kandinsky::assertOrExit
            (SUB81((ulong)in_stack_fffffffffffffba0 >> 0x38,0),
             (string *)CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_108);
  Kandinsky::Expression::~Expression((Expression *)0x112686);
  Kandinsky::operator<<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  Kandinsky::Expression::evaluate((Expression *)0x1126b2);
  Kandinsky::Variable::evaluate((Variable *)0x1126e6);
  std::__cxx11::to_string((double)in_stack_fffffffffffffba8);
  std::operator+((char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
  std::operator+(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
  Kandinsky::Variable::evaluate((Variable *)0x11274c);
  std::__cxx11::to_string((double)in_stack_fffffffffffffba8);
  std::operator+(in_stack_fffffffffffffbd8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
  std::operator+(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
  Kandinsky::assertOrExit
            (SUB81((ulong)in_stack_fffffffffffffba0 >> 0x38,0),
             (string *)CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_1e0);
  Kandinsky::Expression::~Expression((Expression *)0x11281a);
  Kandinsky::Variable::setValue
            ((Variable *)in_stack_fffffffffffffba0,
             (double)CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
  Kandinsky::operator<<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  dVar2 = Kandinsky::Expression::evaluate((Expression *)0x11285d);
  bVar1 = -(dVar2 == 0.0) & 1;
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Kandinsky::Variable::evaluate((Variable *)0x11288c);
  std::__cxx11::to_string((double)in_stack_fffffffffffffba8);
  std::operator+((char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
  std::operator+(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
  Kandinsky::Variable::evaluate((Variable *)0x1128f2);
  std::__cxx11::to_string((double)in_stack_fffffffffffffba8);
  std::operator+(pbVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT17(bVar1,in_stack_fffffffffffffbd0));
  std::operator+(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
  Kandinsky::assertOrExit
            (SUB81((ulong)in_stack_fffffffffffffba0 >> 0x38,0),
             (string *)CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
  std::__cxx11::string::~string(local_238);
  std::__cxx11::string::~string(local_258);
  std::__cxx11::string::~string(local_2d8);
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::~string(local_298);
  std::__cxx11::string::~string(local_2b8);
  Kandinsky::Expression::~Expression((Expression *)0x1129c0);
  local_2f4 = 4;
  Kandinsky::operator<<Kandinsky::Variable,_int,_nullptr>
            (in_stack_fffffffffffffca8,(int *)in_stack_fffffffffffffca0);
  Kandinsky::Expression::evaluate((Expression *)0x1129f7);
  Kandinsky::Variable::evaluate((Variable *)0x112a2b);
  std::__cxx11::to_string((double)in_stack_fffffffffffffba8);
  std::operator+((char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
  std::operator+(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
  Kandinsky::assertOrExit
            (SUB81((ulong)in_stack_fffffffffffffba0 >> 0x38,0),
             (string *)CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
  std::__cxx11::string::~string(local_318);
  std::__cxx11::string::~string(local_338);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffca8);
  Kandinsky::Expression::~Expression((Expression *)0x112ad1);
  local_374 = 4;
  Kandinsky::operator<<int,_Kandinsky::Variable,_nullptr>
            ((int *)in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Kandinsky::Expression::evaluate((Expression *)0x112b08);
  bVar1 = -((double)pbVar3 == 0.0) & 1;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          Kandinsky::Variable::evaluate((Variable *)0x112b37);
  std::__cxx11::to_string((double)pbVar3);
  std::operator+((char *)pbVar3,__rhs);
  std::operator+(pbVar3,(char *)__rhs);
  Kandinsky::assertOrExit
            (SUB81((ulong)__rhs >> 0x38,0),(string *)CONCAT17(bVar1,in_stack_fffffffffffffb98));
  std::__cxx11::string::~string(local_398);
  std::__cxx11::string::~string(local_3b8);
  std::__cxx11::string::~string(local_3d8);
  Kandinsky::Expression::~Expression((Expression *)0x112bdd);
  local_4 = 0;
  Kandinsky::Variable::~Variable((Variable *)0x112bf5);
  Kandinsky::Variable::~Variable((Variable *)0x112c02);
  return local_4;
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    Variable y;
    x.setValue(3);
    y.setValue(2);
    assertOrExit((x < y).evaluate() == 0, "(" + std::to_string(x.evaluate()) + " < " + std::to_string(y.evaluate()) + ") != 0");
    assertOrExit((y < x).evaluate() == 1, "(" + std::to_string(y.evaluate()) + " < " + std::to_string(x.evaluate()) + ") != 1");
    y.setValue(3);
    assertOrExit((x < y).evaluate() == 0, "(" + std::to_string(x.evaluate()) + " < " + std::to_string(y.evaluate()) + ") != 0");
    assertOrExit((x < 4).evaluate() == 1, "(" + std::to_string(x.evaluate()) + " < 4) != 1");
    assertOrExit((4 < x).evaluate() == 0, "(4 < " + std::to_string(x.evaluate()) + ") != 0");
    return 0;
}